

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

Result __thiscall
soplex::SPxMainSM<double>::aggregateVars
          (SPxMainSM<double> *this,SPxLPBase<double> *lp,SVectorBase<double> *row,int *i)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  SPxSense SVar8;
  pointer pdVar9;
  Nonzero<double> *pNVar10;
  pointer pdVar11;
  Tolerances *pTVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  Item *pIVar15;
  DataKey *pDVar16;
  int *piVar17;
  bool bVar18;
  SPxMainSM<double> *this_00;
  double dVar19;
  int iVar20;
  AggregationPS *this_01;
  undefined8 *puVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long in_FS_OFFSET;
  double dVar25;
  Real RVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  element_type *peVar32;
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  double dVar36;
  undefined1 auVar37 [16];
  double dVar38;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr;
  double new_up_k;
  uint local_1ac;
  ulong local_1a8;
  double local_168;
  double local_148;
  element_type *local_120;
  element_type *local_118;
  element_type *peStack_110;
  double local_108;
  element_type *peStack_100;
  element_type *local_f8;
  element_type *peStack_f0;
  long local_e0;
  double local_d8;
  element_type *peStack_d0;
  long local_c8;
  double local_c0;
  value_type local_b8;
  undefined1 local_a8 [24];
  element_type *peStack_90;
  SPxMainSM<double> *local_80;
  double local_78;
  uint *local_70;
  double local_68;
  undefined8 uStack_60;
  shared_ptr<soplex::Tolerances> local_58;
  double local_48;
  undefined8 uStack_40;
  
  pdVar9 = (lp->super_LPColSetBase<double>).low.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_d8 = (lp->super_LPRowSetBase<double>).right.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[*i];
  peStack_d0 = (element_type *)0x0;
  pNVar10 = row->m_elem;
  uVar3 = pNVar10->idx;
  uVar4 = pNVar10[1].idx;
  dVar27 = pNVar10->val;
  dVar33 = pNVar10[1].val;
  lVar24 = (long)(int)uVar3;
  dVar28 = pdVar9[lVar24];
  pdVar11 = (lp->super_LPColSetBase<double>).up.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  dVar34 = pdVar11[lVar24];
  lVar23 = (long)(int)uVar4;
  dVar31 = pdVar9[lVar23];
  dVar38 = pdVar11[lVar23];
  local_70 = (uint *)i;
  dVar25 = feastol(this);
  dVar36 = ABS(dVar28);
  if (ABS(dVar28) <= ABS(dVar34)) {
    dVar36 = ABS(dVar34);
  }
  if (dVar36 <= 1.0) {
    dVar36 = 1.0;
  }
  if (ABS((dVar28 - dVar34) / dVar36) <= dVar25) {
    return OKAY;
  }
  dVar25 = feastol(this);
  dVar36 = ABS(dVar31);
  if (ABS(dVar31) <= ABS(dVar38)) {
    dVar36 = ABS(dVar38);
  }
  if (dVar36 <= 1.0) {
    dVar36 = 1.0;
  }
  if (ABS((dVar31 - dVar38) / dVar36) <= dVar25) {
    return OKAY;
  }
  local_48 = dVar27 * dVar33;
  uStack_40 = 0;
  if (0.0 <= local_48) {
    if (local_48 <= 0.0) {
      puVar21 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_b8.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"XMAISM12 This should never happen.","");
      *puVar21 = &PTR__SPxException_0069d438;
      puVar21[1] = puVar21 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar21 + 1),
                 local_b8.
                 super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(undefined1 *)
                         ((long)&(local_b8.
                                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                         (long)local_b8.
                               super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr));
      *puVar21 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar21,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    ::soplex::infinity::__tls_init();
    dVar36 = *(double *)(in_FS_OFFSET + -8);
    peVar32 = (element_type *)-dVar36;
    if (dVar31 <= (double)peVar32) {
      ::soplex::infinity::__tls_init();
      peStack_110 = (element_type *)0x8000000000000000;
      local_118 = peVar32;
    }
    else {
      peStack_110 = peStack_d0;
      local_118 = (element_type *)((local_d8 - dVar33 * dVar31) / dVar27);
    }
    ::soplex::infinity::__tls_init();
    if (dVar36 <= dVar38) {
      ::soplex::infinity::__tls_init();
      peStack_100 = (element_type *)0x0;
      local_108 = dVar36;
    }
    else {
      peStack_100 = peStack_d0;
      local_108 = (local_d8 - dVar33 * dVar38) / dVar27;
    }
    ::soplex::infinity::__tls_init();
    if (dVar28 <= (double)peVar32) {
      ::soplex::infinity::__tls_init();
    }
    else {
      peVar32 = (element_type *)((local_d8 - dVar27 * dVar28) / dVar33);
    }
    local_120 = peVar32;
    ::soplex::infinity::__tls_init();
    local_a8._16_8_ = local_118;
    if (dVar36 <= dVar34) {
      ::soplex::infinity::__tls_init();
    }
    else {
      dVar36 = (local_d8 - dVar27 * dVar34) / dVar33;
    }
  }
  else {
    ::soplex::infinity::__tls_init();
    dVar36 = *(double *)(in_FS_OFFSET + -8);
    if (dVar36 <= dVar38) {
      ::soplex::infinity::__tls_init();
      local_f8 = (element_type *)((ulong)dVar36 ^ 0x8000000000000000);
      peStack_f0 = (element_type *)0x8000000000000000;
    }
    else {
      local_f8 = (element_type *)((local_d8 - dVar33 * dVar38) / dVar27);
      peStack_f0 = peStack_d0;
    }
    ::soplex::infinity::__tls_init();
    local_118 = (element_type *)-dVar36;
    peStack_110 = (element_type *)0x8000000000000000;
    if (dVar31 <= (double)local_118) {
      ::soplex::infinity::__tls_init();
      peStack_100 = (element_type *)0x0;
      local_108 = dVar36;
    }
    else {
      peStack_100 = peStack_d0;
      local_108 = (local_d8 - dVar33 * dVar31) / dVar27;
    }
    ::soplex::infinity::__tls_init();
    if (dVar36 <= dVar34) {
      ::soplex::infinity::__tls_init();
      peVar32 = local_118;
    }
    else {
      peVar32 = (element_type *)((local_d8 - dVar27 * dVar34) / dVar33);
    }
    local_120 = peVar32;
    ::soplex::infinity::__tls_init();
    if (dVar28 <= (double)local_118) {
      ::soplex::infinity::__tls_init();
      local_a8._16_8_ = local_f8;
    }
    else {
      dVar36 = (local_d8 - dVar27 * dVar28) / dVar33;
      local_a8._16_8_ = local_f8;
      peStack_100 = peVar32;
    }
  }
  peStack_90 = (element_type *)local_a8._16_8_;
  local_80 = this;
  local_78 = dVar36;
  ::soplex::infinity::__tls_init();
  local_118 = *(element_type **)(in_FS_OFFSET + -8);
  peStack_110 = (element_type *)0x0;
  local_f8 = (element_type *)-(double)local_118;
  peStack_f0 = (element_type *)0x8000000000000000;
  if ((((double)local_f8 < (double)local_a8._16_8_) ||
      (::soplex::infinity::__tls_init(), local_e0 = lVar23, local_68 = dVar27, dVar25 = dVar33,
      local_1ac = uVar4, local_168 = dVar38, local_148 = dVar31, local_c8 = lVar24,
      local_c0 = dVar28, dVar19 = dVar34, uVar5 = uVar3, local_108 < (double)local_118)) &&
     ((::soplex::infinity::__tls_init(), local_68 = dVar33, dVar25 = dVar27, local_1ac = uVar3,
      local_168 = dVar34, local_148 = dVar28, local_c0 = dVar31, dVar19 = dVar38, uVar5 = uVar4,
      (double)local_f8 < (double)peVar32 ||
      (::soplex::infinity::__tls_init(), local_e0 = lVar24, local_c8 = lVar23,
      dVar36 < (double)local_118)))) {
    pTVar12 = (this->super_SPxSimplifier<double>)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var13 = (this->super_SPxSimplifier<double>)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
      }
    }
    RVar26 = Tolerances::epsilon(pTVar12);
    if (RVar26 <= (double)local_a8._16_8_ - dVar28) {
      bVar18 = false;
      local_e0 = lVar23;
    }
    else {
      pTVar12 = (this->super_SPxSimplifier<double>)._tolerances.
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var14 = (this->super_SPxSimplifier<double>)._tolerances.
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        }
      }
      local_e0 = lVar23;
      RVar26 = Tolerances::epsilon(pTVar12);
      bVar18 = -RVar26 < local_108 - dVar34;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
      }
    }
    if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
    }
    peVar32 = local_120;
    pTVar12 = (this->super_SPxSimplifier<double>)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var13 = (this->super_SPxSimplifier<double>)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (bVar18) {
      if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
        }
      }
      RVar26 = Tolerances::epsilon(pTVar12);
      dVar36 = local_78;
      if (RVar26 <= (double)peVar32 - dVar31) {
        bVar18 = false;
      }
      else {
        pTVar12 = (this->super_SPxSimplifier<double>)._tolerances.
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var14 = (this->super_SPxSimplifier<double>)._tolerances.
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          }
        }
        RVar26 = Tolerances::epsilon(pTVar12);
        bVar18 = -RVar26 < dVar36 - dVar38;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
      }
      if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
      }
      if (!bVar18) {
        local_c8 = local_e0;
        local_e0 = lVar24;
        goto LAB_001f60f5;
      }
    }
    else {
      if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
        }
      }
      RVar26 = Tolerances::epsilon(pTVar12);
      dVar36 = local_78;
      if (RVar26 <= (double)peVar32 - dVar31) {
        bVar18 = false;
      }
      else {
        pTVar12 = (this->super_SPxSimplifier<double>)._tolerances.
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var14 = (this->super_SPxSimplifier<double>)._tolerances.
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
          }
        }
        RVar26 = Tolerances::epsilon(pTVar12);
        bVar18 = -RVar26 < dVar36 - dVar38;
        if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
        }
      }
      if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
      }
      local_68 = dVar27;
      dVar25 = dVar33;
      local_1ac = uVar4;
      local_168 = dVar38;
      local_148 = dVar31;
      local_c8 = lVar24;
      local_c0 = dVar28;
      dVar19 = dVar34;
      uVar5 = uVar3;
      if (bVar18) goto LAB_001f60f5;
    }
    local_68 = dVar27;
    dVar25 = dVar33;
    local_1ac = uVar4;
    local_168 = dVar38;
    local_148 = dVar31;
    local_c8 = lVar24;
    local_c0 = dVar28;
    dVar19 = dVar34;
    uVar5 = uVar3;
    if (ABS(dVar33) < ABS(dVar27)) {
      local_c8 = local_e0;
      local_e0 = lVar24;
      local_68 = dVar33;
      dVar25 = dVar27;
      local_1ac = uVar3;
      local_168 = dVar34;
      local_148 = dVar28;
      local_c0 = dVar31;
      dVar19 = dVar38;
      uVar5 = uVar4;
    }
  }
LAB_001f60f5:
  local_a8._16_8_ = dVar19;
  local_1a8 = (ulong)uVar5;
  pIVar15 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
  pDVar16 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey;
  iVar6 = pDVar16[local_e0].idx;
  uStack_60 = 0;
  dVar27 = -local_68;
  local_108 = local_d8 / dVar25;
  peStack_100 = peStack_d0;
  iVar20 = pIVar15[iVar6].data.super_SVectorBase<double>.memused;
  if (0 < iVar20) {
    iVar7 = pDVar16[local_c8].idx;
    lVar23 = 0;
    do {
      pNVar10 = pIVar15[iVar6].data.super_SVectorBase<double>.m_elem;
      uVar3 = pNVar10[lVar23].idx;
      if (uVar3 != *local_70) {
        dVar33 = pNVar10[lVar23].val;
        dVar28 = (lp->super_LPRowSetBase<double>).left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[(int)uVar3];
        dVar34 = (lp->super_LPRowSetBase<double>).right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[(int)uVar3];
        ::soplex::infinity::__tls_init();
        dVar31 = local_108 * dVar33;
        if ((double)local_f8 < dVar28) {
          local_b8.
          super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)(dVar28 - dVar31);
          (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x33])
                    (lp,(ulong)uVar3,&local_b8,0);
          piVar17 = &(local_80->super_SPxSimplifier<double>).m_chgLRhs;
          *piVar17 = *piVar17 + 1;
        }
        ::soplex::infinity::__tls_init();
        if (dVar34 < (double)local_118) {
          local_b8.
          super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)(dVar34 - dVar31);
          (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x36])
                    (lp,(ulong)uVar3,&local_b8,0);
          piVar17 = &(local_80->super_SPxSimplifier<double>).m_chgLRhs;
          *piVar17 = *piVar17 + 1;
        }
        local_b8.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)(dVar33 * (dVar27 / dVar25));
        pNVar10 = pIVar15[iVar7].data.super_SVectorBase<double>.m_elem;
        if ((pNVar10 != (Nonzero<double> *)0x0) &&
           (lVar24 = (long)pIVar15[iVar7].data.super_SVectorBase<double>.memused, 0 < lVar24)) {
          lVar22 = 0;
          do {
            if (*(uint *)((long)&pNVar10->idx + lVar22) == uVar3) {
              local_b8.
              super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)
                       ((double)local_b8.
                                super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + *(double *)((long)&pNVar10->val + lVar22));
              piVar17 = &(local_80->super_SPxSimplifier<double>).m_remNzos;
              *piVar17 = *piVar17 + 1;
              break;
            }
            lVar22 = lVar22 + 0x10;
          } while (lVar24 * 0x10 != lVar22);
        }
        (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x43])
                  (lp,(ulong)uVar3,local_1a8,&local_b8,0);
        iVar20 = pIVar15[iVar6].data.super_SVectorBase<double>.memused;
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 < iVar20);
  }
  this_00 = local_80;
  dVar33 = (lp->super_LPColSetBase<double>).object.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[local_e0];
  SVar8 = lp->thesense;
  dVar28 = epsZero(local_80);
  if (dVar28 < ABS(dVar33)) {
    if (SVar8 == MINIMIZE) {
      dVar33 = -dVar33;
    }
    (*(this_00->super_SPxSimplifier<double>)._vptr_SPxSimplifier[0x11])(local_108 * dVar33,this_00);
    dVar28 = (lp->super_LPColSetBase<double>).object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[local_c8];
    if (lp->thesense == MINIMIZE) {
      dVar28 = -dVar28;
    }
    local_b8.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)((dVar27 / dVar25) * dVar33 + dVar28);
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x24])(lp,local_1a8,&local_b8,0);
  }
  dVar33 = ABS(local_d8);
  auVar37._8_8_ = dVar25 * local_168;
  auVar37._0_8_ = local_d8;
  dVar28 = ABS(dVar25 * local_168);
  dVar27 = dVar33;
  if (dVar33 <= dVar28) {
    dVar27 = dVar28;
  }
  auVar35._8_8_ = dVar25 * local_148;
  auVar35._0_8_ = local_d8;
  dVar28 = ABS(dVar25 * local_148);
  if (dVar33 <= dVar28) {
    dVar33 = dVar28;
  }
  dVar28 = 1.0;
  if (1.0 <= dVar27) {
    dVar28 = dVar27;
  }
  dVar27 = 1.0;
  if (1.0 <= dVar33) {
    dVar27 = dVar33;
  }
  auVar29._8_8_ = dVar28;
  auVar29._0_8_ = dVar28;
  auVar37 = divpd(auVar37,auVar29);
  dVar38 = auVar37._8_8_;
  dVar31 = auVar37._0_8_ - dVar38;
  auVar30._8_8_ = dVar27;
  auVar30._0_8_ = dVar27;
  auVar37 = divpd(auVar35,auVar30);
  dVar34 = auVar37._0_8_ - auVar37._8_8_;
  dVar33 = epsZero(this_00);
  local_108 = (double)(~-(ulong)(ABS(dVar31) <= dVar33) & (ulong)dVar31);
  peStack_100 = (element_type *)(~(ulong)ABS(dVar38) & (ulong)dVar38);
  dVar33 = epsZero(this_00);
  dVar34 = (double)(~-(ulong)(ABS(dVar34) <= dVar33) & (ulong)dVar34);
  if (local_48 <= 0.0) {
    if (0.0 <= local_48) {
      puVar21 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_b8.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"XMAISM12 This should never happen.","");
      *puVar21 = &PTR__SPxException_0069d438;
      puVar21[1] = puVar21 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar21 + 1),
                 local_b8.
                 super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(undefined1 *)
                         ((long)&(local_b8.
                                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                         (long)local_b8.
                               super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr));
      *puVar21 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar21,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    ::soplex::infinity::__tls_init();
    if (local_148 <= (double)local_f8) {
      ::soplex::infinity::__tls_init();
    }
    else {
      peStack_f0 = (element_type *)0x0;
      local_f8 = (element_type *)((dVar27 * dVar34) / local_68);
    }
    local_120 = local_f8;
    ::soplex::infinity::__tls_init();
    if ((double)local_118 <= local_168) {
      ::soplex::infinity::__tls_init();
      peVar32 = local_f8;
    }
    else {
      peStack_110 = (element_type *)0x0;
      local_118 = (element_type *)((dVar28 * local_108) / local_68);
      peVar32 = local_f8;
    }
  }
  else {
    ::soplex::infinity::__tls_init();
    if ((double)local_118 <= local_168) {
      ::soplex::infinity::__tls_init();
      peVar32 = local_f8;
    }
    else {
      peVar32 = (element_type *)((dVar28 * local_108) / local_68);
    }
    local_120 = peVar32;
    ::soplex::infinity::__tls_init();
    if (local_148 <= (double)local_f8) {
      ::soplex::infinity::__tls_init();
    }
    else {
      peStack_110 = (element_type *)0x0;
      local_118 = (element_type *)((dVar27 * dVar34) / local_68);
    }
  }
  local_78 = (double)local_118;
  dVar27 = epsZero(this_00);
  if (dVar27 < (double)peVar32 - local_c0) {
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2a])(lp,local_1a8,&local_120,0);
    piVar17 = &(this_00->super_SPxSimplifier<double>).m_chgBnds;
    *piVar17 = *piVar17 + 1;
  }
  dVar27 = epsZero(this_00);
  if ((double)local_118 - (double)local_a8._16_8_ < -dVar27) {
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2d])(lp,local_1a8,&local_78,0);
    piVar17 = &(this_00->super_SPxSimplifier<double>).m_chgBnds;
    *piVar17 = *piVar17 + 1;
  }
  this_01 = (AggregationPS *)operator_new(0xa8);
  uVar3 = *local_70;
  local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this_00->super_SPxSimplifier<double>)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this_00->super_SPxSimplifier<double>)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  AggregationPS::AggregationPS
            (this_01,lp,uVar3,local_1ac,local_d8,(double)local_a8._16_8_,local_c0,&local_58);
  local_b8.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<soplex::SPxMainSM<double>::AggregationPS*>
            (&local_b8.
              super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_01);
  if (local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
  ::push_back(&(this_00->m_hist).data,&local_b8);
  piVar17 = (this_00->m_rIdx).data;
  piVar17[(int)*local_70] =
       piVar17[(long)(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum + -1];
  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0xf])(lp);
  piVar17 = (this_00->m_cIdx).data;
  piVar17[local_e0] =
       piVar17[(long)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum + -1];
  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x15])(lp,(ulong)local_1ac);
  uVar1 = (this_00->super_SPxSimplifier<double>).m_remRows;
  uVar2 = (this_00->super_SPxSimplifier<double>).m_remCols;
  (this_00->super_SPxSimplifier<double>).m_remRows = uVar1 + 1;
  (this_00->super_SPxSimplifier<double>).m_remCols = uVar2 + 1;
  piVar17 = &(this_00->super_SPxSimplifier<double>).m_remNzos;
  *piVar17 = *piVar17 + 2;
  piVar17 = (this_00->m_stat).data + 0xf;
  *piVar17 = *piVar17 + 1;
  if (local_b8.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.
               super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::aggregateVars(SPxLPBase<R>& lp,
      const SVectorBase<R>& row, int& i)
{
   assert(row.size() == 2);
   assert(EQrel(lp.lhs(i), lp.rhs(i), feastol()));

   R rhs = lp.rhs(i);
   assert(rhs < R(infinity) && rhs > R(-infinity));

   int j = row.index(0);
   int k = row.index(1);
   R aij = row.value(0);
   R aik = row.value(1);
   R lower_j = lp.lower(j);
   R upper_j = lp.upper(j);
   R lower_k = lp.lower(k);
   R upper_k = lp.upper(k);

   // fixed variables should be removed by simplifyCols()
   if(EQrel(lower_j, upper_j, feastol()) || EQrel(lower_k, upper_k, feastol()))
      return this->OKAY;

   assert(isNotZero(aij, this->epsZero()) && isNotZero(aik, this->epsZero()));

   SPxOut::debug(this, "IMAISM23 row {}: doubleton equation -> {} x_{} + {} x_{} = {}", i, aij, j, aik,
                 k, rhs);

   // determine which variable can be aggregated without requiring bound tightening of the other variable
   R new_lo_j;
   R new_up_j;
   R new_lo_k;
   R new_up_k;

   if(aij * aik < 0.0)
   {
      // orientation persists
      new_lo_j = (upper_k >=  R(infinity)) ? R(-infinity) : (rhs - aik * upper_k) / aij;
      new_up_j = (lower_k <= R(-infinity)) ?  R(infinity) : (rhs - aik * lower_k) / aij;
      new_lo_k = (upper_j >=  R(infinity)) ? R(-infinity) : (rhs - aij * upper_j) / aik;
      new_up_k = (lower_j <= R(-infinity)) ?  R(infinity) : (rhs - aij * lower_j) / aik;
   }
   else if(aij * aik > 0.0)
   {
      // orientation is reversed
      new_lo_j = (lower_k <= R(-infinity)) ? R(-infinity) : (rhs - aik * lower_k) / aij;
      new_up_j = (upper_k >=  R(infinity)) ?  R(infinity) : (rhs - aik * upper_k) / aij;
      new_lo_k = (lower_j <= R(-infinity)) ? R(-infinity) : (rhs - aij * lower_j) / aik;
      new_up_k = (upper_j >=  R(infinity)) ?  R(infinity) : (rhs - aij * upper_j) / aik;
   }
   else
      throw SPxInternalCodeException("XMAISM12 This should never happen.");

   bool flip_jk = false;

   if(new_lo_j <= R(-infinity) && new_up_j >= R(infinity))
   {
      // no bound tightening on x_j when x_k is aggregated
      flip_jk = true;
   }
   else if(new_lo_k <= R(-infinity) && new_up_k >= R(infinity))
   {
      // no bound tightening on x_k when x_j is aggregated
      flip_jk = false;
   }
   else if(LE(new_lo_j, lower_j, this->tolerances()->epsilon())
           && GE(new_up_j, upper_j, this->tolerances()->epsilon()))
   {
      if(LE(new_lo_k, lower_k, this->tolerances()->epsilon())
            && GE(new_up_k, upper_k, this->tolerances()->epsilon()))
      {
         // both variables' bounds are not affected by aggregation; choose the better aggregation coeff (aik/aij)
         if(spxAbs(aij) > spxAbs(aik))
            flip_jk = false;
         else
            flip_jk = true;
      }
      else
         flip_jk = false;
   }
   else if(LE(new_lo_k, lower_k, this->tolerances()->epsilon())
           && GE(new_up_k, upper_k, this->tolerances()->epsilon()))
   {
      flip_jk = true;
   }
   else
   {
      if(spxAbs(aij) > spxAbs(aik))
         flip_jk = false;
      else
         flip_jk = true;
   }

   if(flip_jk)
   {
      int _j = j;
      R _aij = aij;
      R _lower_j = lower_j;
      R _upper_j = upper_j;
      j = k;
      k = _j;
      aij = aik;
      aik = _aij;
      lower_j = lower_k;
      lower_k = _lower_j;
      upper_j = upper_k;
      upper_k = _upper_j;
   }

   const SVectorBase<R>& col_j = lp.colVector(j);
   const SVectorBase<R>& col_k = lp.colVector(k);

   // aggregation coefficients (x_j = aggr_coef * x_k + aggr_const)
   R aggr_coef = - (aik / aij);
   R aggr_const = rhs / aij;

   SPxOut::debug(this, " removed, replacing x_{} with {} + {} * x_{}\n", j, aggr_const, aggr_coef, k);

   // replace all occurrences of x_j
   for(int r = 0; r < col_j.size(); ++r)
   {
      int row_r = col_j.index(r);
      R arj = col_j.value(r);

      // skip row i
      if(row_r == i)
         continue;

      // adapt sides of row r
      R lhs_r = lp.lhs(row_r);
      R rhs_r = lp.rhs(row_r);

      if(lhs_r > R(-infinity))
      {
         lp.changeLhs(row_r, lhs_r - aggr_const * arj);
         this->m_chgLRhs++;
      }

      if(rhs_r < R(infinity))
      {
         lp.changeRhs(row_r, rhs_r - aggr_const * arj);
         this->m_chgLRhs++;
      }

      R newcoef = aggr_coef * arj;
      int pos_rk = col_k.pos(row_r);

      // check whether x_k is also present in row r and get its coefficient
      if(pos_rk >= 0)
      {
         R ark = col_k.value(pos_rk);
         newcoef += ark;
         this->m_remNzos++;
      }

      // add new column k to row r or adapt the coefficient a_rk
      lp.changeElement(row_r, k, newcoef);
   }

   // adapt objective function
   R obj_j = lp.obj(j);

   if(isNotZero(obj_j, this->epsZero()))
   {
      this->addObjoffset(aggr_const * obj_j);
      R obj_k = lp.obj(k);
      lp.changeObj(k, obj_k + aggr_coef * obj_j);
   }

   // adapt bounds of x_k
   R scale1 = maxAbs(rhs, aij * upper_j);
   R scale2 = maxAbs(rhs, aij * lower_j);

   if(scale1 < 1.0)
      scale1 = 1.0;

   if(scale2 < 1.0)
      scale2 = 1.0;

   R z1 = (rhs / scale1) - (aij * upper_j / scale1);
   R z2 = (rhs / scale2) - (aij * lower_j / scale2);

   // just some rounding
   if(isZero(z1, this->epsZero()))
      z1 = 0.0;

   if(isZero(z2, this->epsZero()))
      z2 = 0.0;

   // determine which side has to be used for the bounds comparison below
   if(aik * aij > 0.0)
   {
      new_lo_k = (upper_j >=  R(infinity)) ? R(-infinity) : z1 * scale1 / aik;
      new_up_k = (lower_j <= R(-infinity)) ?  R(infinity) : z2 * scale2 / aik;
   }
   else if(aik * aij < 0.0)
   {
      new_lo_k = (lower_j <= R(-infinity)) ? R(-infinity) : z2 * scale2 / aik;
      new_up_k = (upper_j >=  R(infinity)) ?  R(infinity) : z1 * scale1 / aik;
   }
   else
      throw SPxInternalCodeException("XMAISM12 This should never happen.");

   // change bounds of x_k if the new ones are tighter
   R oldlower_k = lower_k;
   R oldupper_k = upper_k;

   if(GT(new_lo_k, lower_k, this->epsZero()))
   {
      lp.changeLower(k, new_lo_k);
      this->m_chgBnds++;
   }

   if(LT(new_up_k, upper_k, this->epsZero()))
   {
      lp.changeUpper(k, new_up_k);
      this->m_chgBnds++;
   }

   std::shared_ptr<PostStep> ptr(new AggregationPS(lp, i, j, rhs, oldupper_k, oldlower_k,
                                 this->_tolerances));
   m_hist.append(ptr);

   removeRow(lp, i);
   removeCol(lp, j);

   this->m_remRows++;
   this->m_remCols++;
   this->m_remNzos += 2;

   ++m_stat[AGGREGATION];

   return this->OKAY;
}